

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O3

ON_2fPoint * __thiscall ON_2fPoint::operator=(ON_2fPoint *this,double *p)

{
  ON_2fPoint OVar1;
  
  if (p == (double *)0x0) {
    OVar1.x = 0.0;
    OVar1.y = 0.0;
  }
  else {
    OVar1.x = (float)*p;
    OVar1.y = (float)p[1];
  }
  *this = OVar1;
  return this;
}

Assistant:

ON_2fPoint& ON_2fPoint::operator=(const double* p)
{
  if ( p ) {
    x = (float)p[0];
    y = (float)p[1];
  }
  else {
    x = y = 0.0;
  }
  return *this;
}